

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O3

SPxId __thiscall soplex::SPxDevexPR<double>::selectEnter(SPxDevexPR<double> *this)

{
  SPxSolverBase<double> *pSVar1;
  SPxOut *pSVar2;
  int iVar3;
  DataKey DVar4;
  Verbosity old_verbosity;
  DataKey local_30;
  DataKey local_24;
  undefined4 local_1c;
  
  DVar4 = (DataKey)selectEnterX(this,(this->super_SPxPricer<double>).thetolerance);
  local_30 = DVar4;
  if (DVar4.info < 1) {
LAB_0022f356:
    iVar3 = DVar4.info;
    if (-1 < DVar4.info) goto LAB_0022f35a;
    pSVar1 = (this->super_SPxPricer<double>).thesolver;
    SPxRowId::SPxRowId((SPxRowId *)&local_24,(SPxId *)&local_30);
    iVar3 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(pSVar1->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                        super_SVSetBase<double>.set,&local_24);
    if (pSVar1->theRep * (pSVar1->super_SPxBasisBase<double>).thedesc.rowstat.data[iVar3] < 1) {
      iVar3 = local_30.info;
      goto LAB_0022f35a;
    }
    local_30 = (DataKey)((ulong)local_30 & 0xffffffff00000000);
  }
  else {
    pSVar1 = (this->super_SPxPricer<double>).thesolver;
    SPxColId::SPxColId((SPxColId *)&local_24,(SPxId *)&local_30);
    iVar3 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(pSVar1->super_SPxLPBase<double>).super_LPColSetBase<double>.
                        super_SVSetBase<double>.set,&local_24);
    if (pSVar1->theRep * (pSVar1->super_SPxBasisBase<double>).thedesc.colstat.data[iVar3] < 1) {
      DVar4 = (DataKey)((ulong)local_30 & 0xffffffff);
      goto LAB_0022f356;
    }
    local_30 = (DataKey)((ulong)local_30 & 0xffffffff00000000);
    iVar3 = 0;
LAB_0022f35a:
    if (iVar3 != 0) {
      return (SPxId)local_30;
    }
  }
  if (this->refined != false) {
    return (SPxId)local_30;
  }
  this->refined = true;
  pSVar2 = ((this->super_SPxPricer<double>).thesolver)->spxout;
  if ((pSVar2 != (SPxOut *)0x0) && (4 < (int)pSVar2->m_verbosity)) {
    local_1c = 5;
    local_24.info = pSVar2->m_verbosity;
    (*pSVar2->_vptr_SPxOut[2])();
    pSVar2 = ((this->super_SPxPricer<double>).thesolver)->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar2->m_streams[pSVar2->m_verbosity],"WDEVEX02 trying refinement step..\n",0x22);
    pSVar2 = ((this->super_SPxPricer<double>).thesolver)->spxout;
    (*pSVar2->_vptr_SPxOut[2])(pSVar2,&local_24);
  }
  DVar4 = (DataKey)selectEnterX(this,(this->super_SPxPricer<double>).thetolerance * 0.5);
  local_30 = DVar4;
  if (0 < DVar4.info) {
    pSVar1 = (this->super_SPxPricer<double>).thesolver;
    SPxColId::SPxColId((SPxColId *)&local_24,(SPxId *)&local_30);
    iVar3 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(pSVar1->super_SPxLPBase<double>).super_LPColSetBase<double>.
                        super_SVSetBase<double>.set,&local_24);
    if (0 < pSVar1->theRep * (pSVar1->super_SPxBasisBase<double>).thedesc.colstat.data[iVar3])
    goto LAB_0022f4c7;
    DVar4 = (DataKey)((ulong)local_30 & 0xffffffff);
  }
  if (-1 < DVar4.info) {
    return (SPxId)local_30;
  }
  pSVar1 = (this->super_SPxPricer<double>).thesolver;
  SPxRowId::SPxRowId((SPxRowId *)&local_24,(SPxId *)&local_30);
  iVar3 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                    (&(pSVar1->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                      super_SVSetBase<double>.set,&local_24);
  if (pSVar1->theRep * (pSVar1->super_SPxBasisBase<double>).thedesc.rowstat.data[iVar3] < 1) {
    return (SPxId)local_30;
  }
LAB_0022f4c7:
  local_30 = (DataKey)((ulong)local_30 & 0xffffffff00000000);
  return (SPxId)local_30;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnter()
{
   assert(this->thesolver != nullptr);

   SPxId enterId;

   enterId = selectEnterX(this->thetolerance);

   if(enterId.isSPxColId() && this->thesolver->isBasic(SPxColId(enterId)))
      enterId.info = 0;

   if(enterId.isSPxRowId() && this->thesolver->isBasic(SPxRowId(enterId)))
      enterId.info = 0;

   if(!enterId.isValid() && !refined)
   {
      refined = true;
      SPX_MSG_INFO3((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << "WDEVEX02 trying refinement step..\n";)
      enterId = selectEnterX(this->thetolerance / SOPLEX_DEVEX_REFINETOL);

      if(enterId.isSPxColId() && this->thesolver->isBasic(SPxColId(enterId)))
         enterId.info = 0;

      if(enterId.isSPxRowId() && this->thesolver->isBasic(SPxRowId(enterId)))
         enterId.info = 0;
   }

   return enterId;
}